

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::UpsampleLayerParams::UpsampleLayerParams
          (UpsampleLayerParams *this,UpsampleLayerParams *from)

{
  ulong uVar1;
  int iVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__UpsampleLayerParams_00488f90;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->scalingfactor_,&from->scalingfactor_);
  google::protobuf::RepeatedField<float>::RepeatedField
            (&this->fractionalscalingfactor_,&from->fractionalscalingfactor_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  iVar2 = from->linearupsamplemode_;
  this->mode_ = from->mode_;
  this->linearupsamplemode_ = iVar2;
  return;
}

Assistant:

UpsampleLayerParams::UpsampleLayerParams(const UpsampleLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      scalingfactor_(from.scalingfactor_),
      fractionalscalingfactor_(from.fractionalscalingfactor_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&mode_, &from.mode_,
    static_cast<size_t>(reinterpret_cast<char*>(&linearupsamplemode_) -
    reinterpret_cast<char*>(&mode_)) + sizeof(linearupsamplemode_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.UpsampleLayerParams)
}